

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

void Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parseIfCase
               (char *content,SizeT *offset,SizeT end_offset,SizeT *case_offset,
               SizeT *case_end_offset)

{
  char cVar1;
  bool bVar2;
  char quote_char;
  SizeT *case_end_offset_local;
  SizeT *case_offset_local;
  SizeT end_offset_local;
  SizeT *offset_local;
  char *content_local;
  
  while( true ) {
    bVar2 = false;
    if (*offset < end_offset) {
      bVar2 = content[*offset] == ' ';
    }
    if (!bVar2) break;
    *offset = *offset + 1;
  }
  if (((*offset < end_offset) && (4 < end_offset - *offset)) &&
     (bVar2 = StringUtils::IsEqual<char>(content + *offset,"case",4), bVar2)) {
    *offset = *offset + 4;
    while( true ) {
      bVar2 = false;
      if (*offset < end_offset) {
        bVar2 = content[*offset] != '=';
      }
      if (!bVar2) break;
      *offset = *offset + 1;
    }
    do {
      *offset = *offset + 1;
      bVar2 = false;
      if (*offset < end_offset) {
        bVar2 = content[*offset] == ' ';
      }
    } while (bVar2);
    if (*offset < end_offset) {
      cVar1 = content[*offset];
      *offset = *offset + 1;
      *case_offset = *offset;
      while( true ) {
        bVar2 = false;
        if (*offset < end_offset) {
          bVar2 = content[*offset] != cVar1;
        }
        if (!bVar2) break;
        *offset = *offset + 1;
      }
      *case_end_offset = *offset;
      while( true ) {
        bVar2 = false;
        if (*offset < end_offset) {
          bVar2 = content[*offset] != '>';
        }
        if (!bVar2) break;
        *offset = *offset + 1;
      }
      *offset = *offset + 1;
    }
  }
  return;
}

Assistant:

inline static void parseIfCase(const Char_T *content, SizeT &offset, const SizeT end_offset, SizeT &case_offset,
                                   SizeT &case_end_offset) noexcept {
        while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar)) {
            ++offset;
        }

        if ((offset < end_offset) && ((end_offset - offset) > TagPatterns::CaseLength) &&
            StringUtils::IsEqual((content + offset), TagPatterns::Case, TagPatterns::CaseLength)) {
            offset += TagPatterns::CaseLength;

            while ((offset < end_offset) && (content[offset] != TagPatterns::EqualChar)) {
                ++offset;
            }

            do {
                ++offset;
            } while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar));

            if (offset < end_offset) {
                const Char_T quote_char = content[offset];

                ++offset;

                case_offset = offset;

                while ((offset < end_offset) && (content[offset] != quote_char)) {
                    ++offset;
                }

                case_end_offset = offset;

                while ((offset < end_offset) && (content[offset] != TagPatterns::MultiLineLastChar)) {
                    ++offset;
                }

                ++offset;
            }
        }
    }